

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoAttribute
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  Attribute Attr;
  DWARFObject *pDVar1;
  char *pcVar2;
  Child LHS;
  Child CVar3;
  Child CVar4;
  ArrayRef<unsigned_char> D;
  uint *puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  Tag TVar9;
  int iVar10;
  undefined4 extraout_var;
  DWARFAbbreviationDeclaration *pDVar11;
  undefined4 extraout_var_00;
  DWARFDebugLoc *this_00;
  LocationList *pLVar12;
  raw_ostream *prVar13;
  Tag TVar14;
  ulong uVar15;
  void *__buf;
  DWARFDebugInfoEntry *pDVar16;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *extraout_RDX_00;
  void *pvVar17;
  Child CVar18;
  char *pcVar19;
  uint Tag;
  NodeKind in_R8B;
  long lVar20;
  Child CVar21;
  StringRef Fmt;
  ArrayRef<unsigned_char> D_00;
  DWARFDie DVar22;
  Optional<unsigned_long> OVar23;
  Twine local_198;
  Twine local_180;
  StringRef local_168;
  StringRef local_158;
  StringRef local_148;
  Twine local_138;
  undefined1 local_120 [8];
  Optional<unsigned_long> SectionOffset;
  Child CStack_108;
  anon_class_24_3_3ca02edf VerifyLocationExpr;
  long local_e8;
  void *local_e0;
  long local_d0;
  Child local_b0;
  undefined8 uStack_a8;
  NodeKind local_a0;
  char cStack_9f;
  undefined6 uStack_9e;
  undefined1 local_94 [8];
  uint NumErrors;
  undefined4 uStack_88;
  undefined4 uStack_84;
  NodeKind local_80;
  char cStack_7f;
  undefined6 uStack_7e;
  Child local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  NodeKind local_68;
  char cStack_67;
  undefined6 uStack_66;
  undefined1 local_60 [8];
  anon_class_24_3_98b65f3c ReportError;
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  
  local_60 = (undefined1  [8])local_94;
  local_94._0_4_ = 0;
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  Attr = AttrValue->Attr;
  ReportError.NumErrors = (uint *)this;
  ReportError.this = (DWARFVerifier *)Die;
  if (Attr < DW_AT_specification) {
    if (Attr == DW_AT_location) {
      VerifyLocationExpr.this = (DWARFVerifier *)local_60;
      CStack_108 = (Child)Die;
      VerifyLocationExpr.Die = (DWARFDie *)this;
      DWARFFormValue::getAsBlock
                ((Optional<llvm::ArrayRef<unsigned_char>_> *)&ReportError.Die,&AttrValue->Value);
      if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
        D.Data._4_4_ = ReportError.Die._4_4_;
        D.Data._0_4_ = ReportError.Die._0_4_;
        D.Length._0_4_ = Expr.Storage.field_0._0_4_;
        D.Length._4_4_ = Expr.Storage.field_0._4_4_;
        verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                  ((anon_class_24_3_3ca02edf *)&CStack_108,D);
        return local_94._0_4_;
      }
      OVar23 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
      if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return local_94._0_4_;
      }
      this_00 = DWARFContext::getDebugLoc(this->DCtx);
      if (this_00 == (DWARFDebugLoc *)0x0) {
        return local_94._0_4_;
      }
      pLVar12 = DWARFDebugLoc::getLocationListAtOffset(this_00,OVar23.Storage.field_0.value);
      if (pLVar12 == (LocationList *)0x0) {
        return local_94._0_4_;
      }
      uVar15 = (ulong)(pLVar12->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                      super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                      super_SmallVectorBase.Size;
      if (uVar15 == 0) {
        return local_94._0_4_;
      }
      pvVar17 = (pLVar12->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                super_SmallVectorBase.BeginX;
      lVar20 = 0;
      do {
        D_00.Length._0_4_ = *(undefined4 *)((long)pvVar17 + lVar20 + 0x18);
        D_00.Data = (uchar *)*(undefined8 *)((long)pvVar17 + lVar20 + 0x10);
        D_00.Length._4_4_ = 0;
        verifyDebugInfoAttribute::anon_class_24_3_3ca02edf::operator()
                  ((anon_class_24_3_3ca02edf *)&CStack_108,D_00);
        lVar20 = lVar20 + 0x28;
      } while (uVar15 * 0x28 != lVar20);
      return local_94._0_4_;
    }
    if (Attr != DW_AT_stmt_list) {
      if (Attr != 0x31) {
        return 0;
      }
LAB_00b18b6c:
      DVar22 = DWARFDie::getAttributeValueAsReferencedDie(Die,Attr);
      if (DVar22.Die == (DWARFDebugInfoEntry *)0x0 || DVar22.U == (DWARFUnit *)0x0) {
        return local_94._0_4_;
      }
      pDVar11 = DWARFDie::getAbbreviationDeclarationPtr(Die);
      if (pDVar11 == (DWARFAbbreviationDeclaration *)0x0) {
        TVar9 = DW_TAG_null;
      }
      else {
        TVar9 = pDVar11->Tag;
      }
      pDVar11 = (DVar22.Die)->AbbrevDecl;
      if (pDVar11 == (DWARFAbbreviationDeclaration *)0x0) {
        TVar14 = DW_TAG_null;
      }
      else {
        TVar14 = pDVar11->Tag;
      }
      if (TVar9 == TVar14) {
        return local_94._0_4_;
      }
      if ((TVar9 == DW_TAG_inlined_subroutine) && (TVar14 == DW_TAG_subprogram)) {
        return local_94._0_4_;
      }
      if (TVar14 == DW_TAG_member && TVar9 == DW_TAG_variable) {
        return local_94._0_4_;
      }
      if (TVar9 == DW_TAG_GNU_call_site && TVar14 == DW_TAG_subprogram) {
        return local_94._0_4_;
      }
      local_168 = dwarf::TagString((uint)TVar9);
      Twine::Twine((Twine *)&local_b0,"DIE with tag ",&local_168);
      Twine::Twine((Twine *)local_120," has ");
      operator+((Twine *)&local_78,(Twine *)&local_b0,(Twine *)local_120);
      local_158 = dwarf::AttributeString((uint)Attr);
      Twine::Twine(&local_138,&local_158);
      operator+((Twine *)(local_94 + 4),(Twine *)&local_78,&local_138);
      Twine::Twine(&local_198," that points to DIE with incompatible tag ");
      operator+((Twine *)&ReportError.Die,(Twine *)(local_94 + 4),&local_198);
      local_148 = dwarf::TagString((uint)TVar14);
      Twine::Twine(&local_180,&local_148);
      operator+((Twine *)&CStack_108,(Twine *)&ReportError.Die,&local_180);
      verifyDebugInfoAttribute::anon_class_24_3_98b65f3c::operator()
                ((anon_class_24_3_98b65f3c *)local_60,(Twine *)&CStack_108);
      return local_94._0_4_;
    }
    OVar23 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    _local_120 = OVar23.Storage._0_9_;
    if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      iVar10 = (*pDVar1->_vptr_DWARFObject[0xf])(pDVar1);
      if (*(ulong *)(CONCAT44(extraout_var_00,iVar10) + 8) <= OVar23.Storage.field_0.value) {
        Twine::Twine((Twine *)(local_94 + 4),"DW_AT_stmt_list offset is beyond .debug_line bounds: "
                    );
        if (SectionOffset.Storage.field_0.empty == '\0') {
          __assert_fail("hasVal",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                        ,0xad,
                        "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                       );
        }
        local_b0.twine = (Twine *)&PTR_anchor_00d8d3f8;
        uStack_a8 = local_120;
        Fmt.Length = 6;
        Fmt.Data = "{0:x8}";
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_>::
        formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                        *)&CStack_108,Fmt,
                       (tuple<llvm::detail::provider_format_adapter<unsigned_long_&>_> *)&local_b0);
        Twine::Twine((Twine *)&local_78,(formatv_object_base *)&CStack_108);
        if ((local_80 == NullKind) || (local_68 == NullKind)) {
          ReportError.Die._0_4_ = 0;
          ReportError.Die._4_4_ = 0;
          uVar6 = ReportError.Die._0_4_;
          uVar7 = ReportError.Die._4_4_;
        }
        else {
          uVar6 = local_78.decUI;
          uVar7 = local_78._4_4_;
          if ((local_80 != EmptyKind) &&
             (uVar6 = local_94._4_4_, uVar7 = NumErrors, local_68 != EmptyKind)) {
            LHS._4_4_ = NumErrors;
            LHS.decUI = local_94._4_4_;
            if (cStack_7f != '\x01') {
              local_80 = TwineKind;
              LHS.twine = (Twine *)(local_94 + 4);
            }
            in_R8B = local_68;
            if (cStack_67 != '\x01') {
              in_R8B = TwineKind;
            }
            CVar4._4_4_ = local_78._4_4_;
            CVar4.decUI = local_78.decUI;
            CVar18.twine = (Twine *)&local_78;
            if (cStack_67 == '\x01') {
              CVar18 = CVar4;
            }
            Twine::Twine((Twine *)&ReportError.Die,LHS,local_80,CVar18,in_R8B);
            uVar6 = ReportError.Die._0_4_;
            uVar7 = ReportError.Die._4_4_;
          }
        }
        ReportError.Die._4_4_ = uVar7;
        ReportError.Die._0_4_ = uVar6;
        puVar5 = ReportError.NumErrors;
        *(int *)(_func_int ***)local_60 = *(int *)(_func_int ***)local_60 + 1;
        pcVar19 = (char *)0x0;
        prVar13 = WithColor::error(*(WithColor **)puVar5,(raw_ostream *)0xbe8acc,
                                   (StringRef)ZEXT816(0),(bool)in_R8B);
        Twine::print((Twine *)&ReportError.Die,prVar13);
        pcVar2 = prVar13->OutBufCur;
        if (pcVar2 < prVar13->OutBufEnd) {
          pcVar19 = pcVar2 + 1;
          prVar13->OutBufCur = pcVar19;
          *pcVar2 = '\n';
        }
        else {
          raw_ostream::write(prVar13,10,__buf_02,(size_t)pcVar19);
        }
        DWARFDie::dump((DWARFDie *)ReportError.this,*(raw_ostream **)puVar5,0,
                       *(DIDumpOptions *)(puVar5 + 4));
        prVar13 = *(raw_ostream **)puVar5;
        pcVar2 = prVar13->OutBufCur;
        if (pcVar2 < prVar13->OutBufEnd) {
          prVar13->OutBufCur = pcVar2 + 1;
          *pcVar2 = '\n';
        }
        else {
          raw_ostream::write(prVar13,10,__buf_03,(size_t)pcVar19);
        }
        if (local_e0 != (void *)0x0) {
          operator_delete(local_e0,local_d0 - (long)local_e0);
        }
        if (VerifyLocationExpr.this != (DWARFVerifier *)0x0) {
          operator_delete(VerifyLocationExpr.this,local_e8 - (long)VerifyLocationExpr.this);
        }
      }
      if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return local_94._0_4_;
      }
    }
    pcVar19 = "DIE has invalid DW_AT_stmt_list encoding:";
  }
  else {
    if (Attr == DW_AT_specification) goto LAB_00b18b6c;
    if (Attr == DW_AT_type) {
      DVar22 = DWARFDie::getAttributeValueAsReferencedDie(Die,DW_AT_type);
      pDVar16 = DVar22.Die;
      if (pDVar16 == (DWARFDebugInfoEntry *)0x0 || DVar22.U == (DWARFUnit *)0x0) {
        return local_94._0_4_;
      }
      if (pDVar16->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
        TVar9 = DW_TAG_null;
      }
      else {
        TVar9 = pDVar16->AbbrevDecl->Tag;
      }
      bVar8 = dwarf::isType(TVar9);
      if (bVar8) {
        return local_94._0_4_;
      }
      _local_120 = dwarf::AttributeString(0x49);
      Twine::Twine((Twine *)(local_94 + 4),"DIE has ",(StringRef *)local_120);
      Twine::Twine((Twine *)&local_78," with incompatible tag ");
      if ((local_80 == NullKind) || (local_68 == NullKind)) {
        ReportError.Die._0_4_ = 0;
        ReportError.Die._4_4_ = 0;
        Expr.Storage.field_0._0_4_ = 0;
        Expr.Storage.field_0._4_4_ = 0;
        Expr.Storage.field_0.value.Length._0_2_ = 0x100;
      }
      else if (local_80 == EmptyKind) {
        Expr.Storage.field_0.value.Length = CONCAT62(uStack_66,CONCAT11(cStack_67,local_68));
        ReportError.Die._0_4_ = local_78.decUI;
        ReportError.Die._4_4_ = local_78._4_4_;
        Expr.Storage.field_0._0_4_ = uStack_70;
        Expr.Storage.field_0._4_4_ = uStack_6c;
      }
      else if (local_68 == EmptyKind) {
        Expr.Storage.field_0.value.Length = CONCAT62(uStack_7e,CONCAT11(cStack_7f,local_80));
        ReportError.Die._0_4_ = local_94._4_4_;
        ReportError.Die._4_4_ = NumErrors;
        Expr.Storage.field_0._0_4_ = uStack_88;
        Expr.Storage.field_0._4_4_ = uStack_84;
      }
      else {
        CVar18._4_4_ = NumErrors;
        CVar18.decUI = local_94._4_4_;
        if (cStack_7f != '\x01') {
          local_80 = TwineKind;
          CVar18.twine = (Twine *)(local_94 + 4);
        }
        in_R8B = local_68;
        if (cStack_67 != '\x01') {
          in_R8B = TwineKind;
        }
        CVar3._4_4_ = local_78._4_4_;
        CVar3.decUI = local_78.decUI;
        CVar21.twine = (Twine *)&local_78;
        if (cStack_67 == '\x01') {
          CVar21 = CVar3;
        }
        Twine::Twine((Twine *)&ReportError.Die,CVar18,local_80,CVar21,in_R8B);
      }
      if (pDVar16->AbbrevDecl == (DWARFAbbreviationDeclaration *)0x0) {
        Tag = 0;
      }
      else {
        Tag = (uint)pDVar16->AbbrevDecl->Tag;
      }
      local_138._0_16_ = dwarf::TagString(Tag);
      Twine::Twine((Twine *)&local_b0,(StringRef *)&local_138);
      if ((Expr.Storage.field_0.value.Length._0_1_ == '\0') || (local_a0 == NullKind)) {
        CStack_108.twine = (Twine *)0x0;
        VerifyLocationExpr.Die = (DWARFDie *)0x0;
        VerifyLocationExpr.this = (DWARFVerifier *)CONCAT62(VerifyLocationExpr.this._2_6_,0x100);
      }
      else {
        if (Expr.Storage.field_0.value.Length._0_1_ == '\x01') {
          VerifyLocationExpr.this =
               (DWARFVerifier *)CONCAT62(uStack_9e,CONCAT11(cStack_9f,local_a0));
          CStack_108.decUI = local_b0.decUI;
          CStack_108._4_4_ = local_b0._4_4_;
          Expr.Storage.field_0._0_4_ = (undefined4)uStack_a8;
          Expr.Storage.field_0._4_4_ = uStack_a8._4_4_;
        }
        else {
          if (local_a0 != EmptyKind) {
            CVar21._4_4_ = ReportError.Die._4_4_;
            CVar21.decUI = ReportError.Die._0_4_;
            if (Expr.Storage.field_0.value.Length._1_1_ != '\x01') {
              Expr.Storage.field_0.value.Length._0_1_ = TwineKind;
              CVar21 = (Child)&ReportError.Die;
            }
            CVar18 = local_b0;
            in_R8B = local_a0;
            if (cStack_9f != '\x01') {
              in_R8B = TwineKind;
              CVar18.twine = (Twine *)&local_b0;
            }
            Twine::Twine((Twine *)&CStack_108,CVar21,Expr.Storage.field_0.value.Length._0_1_,CVar18,
                         in_R8B);
            goto LAB_00b1914b;
          }
          VerifyLocationExpr.this = (DWARFVerifier *)Expr.Storage.field_0.value.Length;
          CStack_108.decUI = ReportError.Die._0_4_;
          CStack_108._4_4_ = ReportError.Die._4_4_;
        }
        VerifyLocationExpr.Die =
             (DWARFDie *)CONCAT44(Expr.Storage.field_0._4_4_,Expr.Storage.field_0._0_4_);
      }
LAB_00b1914b:
      puVar5 = ReportError.NumErrors;
      *(int *)(_func_int ***)local_60 = *(int *)(_func_int ***)local_60 + 1;
      pcVar19 = (char *)0x0;
      prVar13 = WithColor::error(*(WithColor **)puVar5,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0)
                                 ,(bool)in_R8B);
      Twine::print((Twine *)&CStack_108,prVar13);
      pcVar2 = prVar13->OutBufCur;
      if (pcVar2 < prVar13->OutBufEnd) {
        pcVar19 = pcVar2 + 1;
        prVar13->OutBufCur = pcVar19;
        *pcVar2 = '\n';
      }
      else {
        raw_ostream::write(prVar13,10,__buf_01,(size_t)pcVar19);
      }
      DWARFDie::dump((DWARFDie *)ReportError.this,*(raw_ostream **)puVar5,0,
                     *(DIDumpOptions *)(puVar5 + 4));
      prVar13 = *(raw_ostream **)puVar5;
      pvVar17 = extraout_RDX;
      goto LAB_00b19362;
    }
    if (Attr != DW_AT_ranges) {
      return 0;
    }
    OVar23 = DWARFFormValue::getAsSectionOffset(&AttrValue->Value);
    if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      iVar10 = (*pDVar1->_vptr_DWARFObject[0x12])(pDVar1);
      if (*(ulong *)(CONCAT44(extraout_var,iVar10) + 8) <= OVar23.Storage.field_0.value) {
        Twine::Twine((Twine *)&CStack_108,"DW_AT_ranges offset is beyond .debug_ranges bounds:");
        puVar5 = ReportError.NumErrors;
        *(int *)(_func_int ***)local_60 = *(int *)(_func_int ***)local_60 + 1;
        pcVar19 = (char *)0x0;
        prVar13 = WithColor::error(*(WithColor **)puVar5,(raw_ostream *)0xbe8acc,
                                   (StringRef)ZEXT816(0),(bool)in_R8B);
        Twine::print((Twine *)&CStack_108,prVar13);
        pcVar2 = prVar13->OutBufCur;
        if (pcVar2 < prVar13->OutBufEnd) {
          pcVar19 = pcVar2 + 1;
          prVar13->OutBufCur = pcVar19;
          *pcVar2 = '\n';
        }
        else {
          raw_ostream::write(prVar13,10,__buf,(size_t)pcVar19);
        }
        DWARFDie::dump((DWARFDie *)ReportError.this,*(raw_ostream **)puVar5,0,
                       *(DIDumpOptions *)(puVar5 + 4));
        prVar13 = *(raw_ostream **)puVar5;
        pcVar2 = prVar13->OutBufCur;
        if (pcVar2 < prVar13->OutBufEnd) {
          prVar13->OutBufCur = pcVar2 + 1;
          *pcVar2 = '\n';
        }
        else {
          raw_ostream::write(prVar13,10,__buf_00,(size_t)pcVar19);
        }
      }
      if (((undefined1  [16])OVar23.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return local_94._0_4_;
      }
    }
    pcVar19 = "DIE has invalid DW_AT_ranges encoding:";
  }
  Twine::Twine((Twine *)&CStack_108,pcVar19);
  puVar5 = ReportError.NumErrors;
  *(int *)(_func_int ***)local_60 = *(int *)(_func_int ***)local_60 + 1;
  pcVar19 = (char *)0x0;
  prVar13 = WithColor::error(*(WithColor **)puVar5,(raw_ostream *)0xbe8acc,(StringRef)ZEXT816(0),
                             (bool)in_R8B);
  Twine::print((Twine *)&CStack_108,prVar13);
  pcVar2 = prVar13->OutBufCur;
  if (pcVar2 < prVar13->OutBufEnd) {
    pcVar19 = pcVar2 + 1;
    prVar13->OutBufCur = pcVar19;
    *pcVar2 = '\n';
  }
  else {
    raw_ostream::write(prVar13,10,__buf_04,(size_t)pcVar19);
  }
  DWARFDie::dump((DWARFDie *)ReportError.this,*(raw_ostream **)puVar5,0,
                 *(DIDumpOptions *)(puVar5 + 4));
  prVar13 = *(raw_ostream **)puVar5;
  pvVar17 = extraout_RDX_00;
LAB_00b19362:
  pcVar2 = prVar13->OutBufCur;
  if (pcVar2 < prVar13->OutBufEnd) {
    prVar13->OutBufCur = pcVar2 + 1;
    *pcVar2 = '\n';
  }
  else {
    raw_ostream::write(prVar13,10,pvVar17,(size_t)pcVar19);
  }
  return local_94._0_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoAttribute(const DWARFDie &Die,
                                                 DWARFAttribute &AttrValue) {
  unsigned NumErrors = 0;
  auto ReportError = [&](const Twine &TitleMsg) {
    ++NumErrors;
    error() << TitleMsg << '\n';
    dump(Die) << '\n';
  };

  const DWARFObject &DObj = DCtx.getDWARFObj();
  const auto Attr = AttrValue.Attr;
  switch (Attr) {
  case DW_AT_ranges:
    // Make sure the offset in the DW_AT_ranges attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getRangesSection().Data.size())
        ReportError("DW_AT_ranges offset is beyond .debug_ranges bounds:");
      break;
    }
    ReportError("DIE has invalid DW_AT_ranges encoding:");
    break;
  case DW_AT_stmt_list:
    // Make sure the offset in the DW_AT_stmt_list attribute is valid.
    if (auto SectionOffset = AttrValue.Value.getAsSectionOffset()) {
      if (*SectionOffset >= DObj.getLineSection().Data.size())
        ReportError("DW_AT_stmt_list offset is beyond .debug_line bounds: " +
                    llvm::formatv("{0:x8}", *SectionOffset));
      break;
    }
    ReportError("DIE has invalid DW_AT_stmt_list encoding:");
    break;
  case DW_AT_location: {
    auto VerifyLocationExpr = [&](ArrayRef<uint8_t> D) {
      DWARFUnit *U = Die.getDwarfUnit();
      DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), 0);
      DWARFExpression Expression(Data, U->getVersion(),
                                 U->getAddressByteSize());
      bool Error = llvm::any_of(Expression, [](DWARFExpression::Operation &Op) {
        return Op.isError();
      });
      if (Error || !Expression.verify(U))
        ReportError("DIE contains invalid DWARF expression:");
    };
    if (Optional<ArrayRef<uint8_t>> Expr = AttrValue.Value.getAsBlock()) {
      // Verify inlined location.
      VerifyLocationExpr(*Expr);
    } else if (auto LocOffset = AttrValue.Value.getAsSectionOffset()) {
      // Verify location list.
      if (auto DebugLoc = DCtx.getDebugLoc())
        if (auto LocList = DebugLoc->getLocationListAtOffset(*LocOffset))
          for (const auto &Entry : LocList->Entries)
            VerifyLocationExpr(Entry.Loc);
    }
    break;
  }
  case DW_AT_specification:
  case DW_AT_abstract_origin: {
    if (auto ReferencedDie = Die.getAttributeValueAsReferencedDie(Attr)) {
      auto DieTag = Die.getTag();
      auto RefTag = ReferencedDie.getTag();
      if (DieTag == RefTag)
        break;
      if (DieTag == DW_TAG_inlined_subroutine && RefTag == DW_TAG_subprogram)
        break;
      if (DieTag == DW_TAG_variable && RefTag == DW_TAG_member)
        break;
      // This might be reference to a function declaration.
      if (DieTag == DW_TAG_GNU_call_site && RefTag == DW_TAG_subprogram)
        break;
      ReportError("DIE with tag " + TagString(DieTag) + " has " +
                  AttributeString(Attr) +
                  " that points to DIE with "
                  "incompatible tag " +
                  TagString(RefTag));
    }
    break;
  }
  case DW_AT_type: {
    DWARFDie TypeDie = Die.getAttributeValueAsReferencedDie(DW_AT_type);
    if (TypeDie && !isType(TypeDie.getTag())) {
      ReportError("DIE has " + AttributeString(Attr) +
                  " with incompatible tag " + TagString(TypeDie.getTag()));
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}